

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getHighsBoolOptionValue(void *highs,char *option,HighsInt *value)

{
  HighsInt HVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Highs_getHighsBoolOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_58,"Highs_getBoolOptionValue",&local_5a);
  Highs::deprecationMessage((Highs *)highs,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  HVar1 = Highs_getBoolOptionValue(highs,option,value);
  return HVar1;
}

Assistant:

HighsInt Highs_getHighsBoolOptionValue(const void* highs, const char* option,
                                       HighsInt* value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_getHighsBoolOptionValue",
                           "Highs_getBoolOptionValue");
  return Highs_getBoolOptionValue(highs, option, value);
}